

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

double __thiscall libtorrent::upnp::log(upnp *this,double __x)

{
  bool bVar1;
  char *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  char local_438 [8];
  char msg [1024];
  va_list v;
  char *fmt_local;
  upnp *this_local;
  
  bVar1 = should_log(this);
  dVar2 = extraout_XMM0_Qa;
  if (bVar1) {
    msg[0x3fc] = '0';
    msg[0x3fd] = '\0';
    msg[0x3fe] = '\0';
    msg[0x3ff] = '\0';
    msg[0x3f8] = '\x10';
    msg[0x3f9] = '\0';
    msg[0x3fa] = '\0';
    msg[0x3fb] = '\0';
    vsnprintf(local_438,0x400,in_RSI,msg + 0x3f8);
    (*this->m_callback->_vptr_portmap_callback[2])
              (this->m_callback,1,local_438,&this->m_listen_handle);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void upnp::log(char const* fmt, ...) const
{
	TORRENT_ASSERT(is_single_thread());
	if (!should_log()) return;
	va_list v;
	va_start(v, fmt);
	char msg[1024];
	std::vsnprintf(msg, sizeof(msg), fmt, v);
	va_end(v);
	m_callback.log_portmap(portmap_transport::upnp, msg, m_listen_handle);
}